

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

int __thiscall sptk::swipe::minv(swipe *this,vector yr_vector)

{
  int i;
  double val;
  int index;
  vector yr_vector_local;
  
  index = -1;
  val = 32767.0;
  for (i = 0; i < (int)this; i = i + 1) {
    if (*(double *)(yr_vector._0_8_ + (long)i * 8) < val) {
      val = *(double *)(yr_vector._0_8_ + (long)i * 8);
      index = i;
    }
  }
  return index;
}

Assistant:

int minv(vector yr_vector) {
    int index = -1;
    double val = SHRT_MAX;
    int i;
    for (i = 0; i < yr_vector.x; i++) {
        if (yr_vector.v[i] < val) {
            val = yr_vector.v[i];
            index = i;
        }
    }
    return(index);
}